

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest12::verifyTexture
          (FunctionalTest12 *this,texture *texture,GLuint *expected_color)

{
  uint uVar1;
  reference pvVar2;
  bool bVar3;
  bool bVar4;
  uint uStack_58;
  bool result;
  GLuint point_offset;
  GLuint x;
  GLuint line_offset;
  GLuint y;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> results;
  GLuint *expected_color_local;
  texture *texture_local;
  FunctionalTest12 *this_local;
  
  results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = expected_color;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,0x400);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,0);
  Utils::texture::get(texture,0x8d99,0x1405,pvVar2);
  x = 0;
  do {
    if (0xf < x) {
      this_local._7_1_ = true;
LAB_01023861:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
      return this_local._7_1_;
    }
    for (uStack_58 = 0; uStack_58 < 0x10; uStack_58 = uStack_58 + 1) {
      uVar1 = x * 0x40 + uStack_58 * 4;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                          (ulong)uVar1);
      bVar3 = false;
      if (*pvVar2 ==
          *results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                            (ulong)(uVar1 + 1));
        bVar3 = *pvVar2 ==
                results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[1];
      }
      bVar4 = false;
      if (bVar3) {
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                            (ulong)(uVar1 + 2));
        bVar4 = *pvVar2 ==
                results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[2];
      }
      bVar3 = false;
      if (bVar4) {
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                            (ulong)(uVar1 + 3));
        bVar3 = *pvVar2 ==
                results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[3];
      }
      if (!bVar3) {
        this_local._7_1_ = false;
        goto LAB_01023861;
      }
    }
    x = x + 1;
  } while( true );
}

Assistant:

bool FunctionalTest12::verifyTexture(Utils::texture& texture, const GLuint expected_color[4]) const
{
	std::vector<GLuint> results;
	results.resize(m_texture_width * m_texture_height * 4);

	texture.get(GL_RGBA_INTEGER, GL_UNSIGNED_INT, &results[0]);

	for (GLuint y = 0; y < m_texture_height; ++y)
	{
		const GLuint line_offset = y * m_texture_width * 4;

		for (GLuint x = 0; x < m_texture_width; ++x)
		{
			const GLuint point_offset = line_offset + x * 4;
			bool		 result		  = true;

			result = result && (results[point_offset + 0] == expected_color[0]);
			result = result && (results[point_offset + 1] == expected_color[1]);
			result = result && (results[point_offset + 2] == expected_color[2]);
			result = result && (results[point_offset + 3] == expected_color[3]);

			if (false == result)
			{
				return false;
			}
		}
	}

	return true;
}